

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

void __thiscall Moc::parseMocInclude(Moc *this)

{
  long lVar1;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->super_Parser).index;
  if (((this->super_Parser).symbols.d.size <= lVar1) ||
     ((this->super_Parser).symbols.d.ptr[lVar1].token != LPAREN)) {
    Parser::error(&this->super_Parser,(char *)0x0);
  }
  (this->super_Parser).index = lVar1 + 1;
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  lexemUntil(&local_38,this,PP_RPAREN);
  QByteArray::remove((longlong)&local_38,0);
  QByteArray::chop((longlong)&local_38);
  QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
            ((QMovableArrayOps<QByteArray> *)&this->includeFiles,(this->includeFiles).d.size,
             &local_38);
  QList<QByteArray>::end(&this->includeFiles);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Moc::parseMocInclude()
{
    next(LPAREN);
    QByteArray include = lexemUntil(RPAREN);
    // remove parentheses
    include.remove(0, 1);
    include.chop(1);
    includeFiles.append(include);
}